

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void IntraChromaPreds_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  uint8_t *top_00;
  uint8_t *left_00;
  
  DC8uvMode_SSE2(dst + 0x400,left,top);
  VerticalPred_SSE2(dst + 0x500,top,8);
  HorizontalPred_SSE2(dst + 0x510,left,8);
  TrueMotion_SSE2(dst + 0x410,left,top,8);
  top_00 = top + 8;
  if (top == (uint8_t *)0x0) {
    top_00 = (uint8_t *)0x0;
  }
  left_00 = left + 0x10;
  if (left == (uint8_t *)0x0) {
    left_00 = (uint8_t *)0x0;
  }
  DC8uvMode_SSE2(dst + 0x408,left_00,top_00);
  VerticalPred_SSE2(dst + 0x508,top_00,8);
  HorizontalPred_SSE2(dst + 0x518,left_00,8);
  TrueMotion_SSE2(dst + 0x418,left_00,top_00,8);
  return;
}

Assistant:

static void IntraChromaPreds_SSE2(uint8_t* WEBP_RESTRICT dst,
                                  const uint8_t* WEBP_RESTRICT left,
                                  const uint8_t* WEBP_RESTRICT top) {
  // U block
  DC8uvMode_SSE2(C8DC8 + dst, left, top);
  VerticalPred_SSE2(C8VE8 + dst, top, 8);
  HorizontalPred_SSE2(C8HE8 + dst, left, 8);
  TrueMotion_SSE2(C8TM8 + dst, left, top, 8);
  // V block
  dst += 8;
  if (top != NULL) top += 8;
  if (left != NULL) left += 16;
  DC8uvMode_SSE2(C8DC8 + dst, left, top);
  VerticalPred_SSE2(C8VE8 + dst, top, 8);
  HorizontalPred_SSE2(C8HE8 + dst, left, 8);
  TrueMotion_SSE2(C8TM8 + dst, left, top, 8);
}